

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall QHttp2Stream::uploadDeviceDestroyed(QHttp2Stream *this)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView message;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x38) != 0) {
    qVar1 = QtPrivate::lengthHelperPointer<char>("Upload device destroyed while uploading");
    message.m_data = "Upload device destroyed while uploading";
    message.m_size = qVar1;
    streamError(this,CANCEL,message);
    latin1.m_data = "Upload device destroyed while uploading";
    latin1.m_size = 0x27;
    QString::QString((QString *)&QStack_38,latin1);
    uploadDeviceError(this,(QString *)&QStack_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  }
  *(undefined8 *)(this + 0x30) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::uploadDeviceDestroyed()
{
    if (isUploadingDATA()) {
        // We're in the middle of sending DATA frames, we need to abort
        // the stream.
        streamError(CANCEL, QLatin1String("Upload device destroyed while uploading"));
        emit uploadDeviceError("Upload device destroyed while uploading"_L1);
    }
    m_uploadDevice = nullptr;
}